

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O3

void __thiscall
ipx::Model::DualizeBackInteriorSolution
          (Model *this,Vector *x_solver,Vector *xl_solver,Vector *xu_solver,Vector *y_solver,
          Vector *zl_solver,Vector *zu_solver,Vector *x_user,Vector *xl_user,Vector *xu_user,
          Vector *slack_user,Vector *y_user,Vector *zl_user,Vector *zu_user)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  pointer pcVar5;
  double *pdVar6;
  double *pdVar7;
  int *piVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double *pdVar11;
  double *pdVar12;
  int *piVar13;
  size_t sVar14;
  int *piVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  undefined1 auVar20 [16];
  double dVar21;
  undefined1 auVar22 [16];
  
  auVar9 = _DAT_003be0d0;
  uVar2 = this->num_rows_;
  uVar17 = (ulong)uVar2;
  lVar19 = (long)this->num_cols_;
  if (this->dualized_ == true) {
    sVar4 = x_user->_M_size;
    sVar14 = y_solver->_M_size;
    if (sVar4 == sVar14) {
      if (sVar4 != 0) {
        pdVar11 = x_user->_M_data;
        pdVar12 = y_solver->_M_data;
        sVar14 = 0;
        do {
          pdVar11[sVar14] = (double)((ulong)pdVar12[sVar14] ^ auVar9._0_8_);
          sVar14 = sVar14 + 1;
        } while (sVar4 != sVar14);
      }
    }
    else {
      if (x_user->_M_data != (double *)0x0) {
        operator_delete(x_user->_M_data);
        sVar14 = y_solver->_M_size;
      }
      x_user->_M_size = sVar14;
      pdVar11 = (double *)operator_new(sVar14 << 3);
      x_user->_M_data = pdVar11;
      auVar9 = _DAT_003be0d0;
      sVar4 = x_user->_M_size;
      if (sVar4 != 0) {
        pdVar12 = y_solver->_M_data;
        sVar14 = 0;
        do {
          pdVar11[sVar14] = (double)((ulong)pdVar12[sVar14] ^ auVar9._0_8_);
          sVar14 = sVar14 + 1;
        } while (sVar4 != sVar14);
      }
    }
    auVar9 = _DAT_003be0d0;
    iVar3 = this->num_constr_;
    if (0 < (long)iVar3) {
      pcVar5 = (this->constr_type_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar11 = xl_solver->_M_data;
      pdVar12 = y_user->_M_data;
      pdVar6 = xu_solver->_M_data;
      pdVar7 = x_solver->_M_data;
      lVar18 = 0;
      do {
        cVar1 = pcVar5[lVar18];
        if (cVar1 == '<') {
          dVar21 = (double)((ulong)pdVar6[lVar18] ^ auVar9._0_8_);
LAB_003aa7a0:
          pdVar12[lVar18] = dVar21;
        }
        else {
          if (cVar1 == '>') {
            dVar21 = pdVar11[lVar18];
            goto LAB_003aa7a0;
          }
          if (cVar1 == '=') {
            dVar21 = pdVar7[lVar18];
            goto LAB_003aa7a0;
          }
        }
        lVar18 = lVar18 + 1;
      } while (iVar3 != lVar18);
    }
    if (0 < (long)this->num_var_) {
      pdVar11 = (double *)zl_user->_M_size;
      if (pdVar11 != (double *)0x0) {
        pdVar11 = zl_user->_M_data;
      }
      pdVar12 = (double *)xl_solver->_M_size;
      if (pdVar12 != (double *)0x0) {
        pdVar12 = xl_solver->_M_data;
      }
      memmove(pdVar11,pdVar12 + lVar19,(long)this->num_var_ << 3);
      iVar3 = this->num_var_;
      if (0 < (long)iVar3) {
        pdVar11 = (this->scaled_lbuser_)._M_data;
        pdVar12 = zl_user->_M_data;
        lVar18 = 0;
        do {
          if (0x7fefffffffffffff < (ulong)ABS(pdVar11[lVar18])) {
            pdVar12[lVar18] = 0.0;
          }
          lVar18 = lVar18 + 1;
        } while (iVar3 != lVar18);
      }
    }
    pdVar11 = zu_user->_M_data;
    if (zu_user->_M_size != 0) {
      memset(pdVar11,0,zu_user->_M_size << 3);
    }
    iVar3 = this->num_constr_;
    lVar18 = (long)iVar3;
    piVar13 = (this->boxed_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar8 = (this->boxed_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (piVar13 != piVar8) {
      pdVar12 = xl_solver->_M_data + lVar18;
      piVar15 = piVar13;
      do {
        pdVar11[*piVar15] = *pdVar12;
        piVar15 = piVar15 + 1;
        pdVar12 = pdVar12 + 1;
      } while (piVar15 != piVar8);
    }
    if (0 < (int)uVar2) {
      pdVar11 = (this->scaled_lbuser_)._M_data;
      pdVar12 = zl_solver->_M_data;
      pdVar6 = xl_user->_M_data;
      uVar16 = 0;
      do {
        dVar21 = INFINITY;
        if ((ulong)ABS(pdVar11[uVar16]) < 0x7ff0000000000000) {
          dVar21 = pdVar12[lVar19 + uVar16];
        }
        pdVar6[uVar16] = dVar21;
        uVar16 = uVar16 + 1;
      } while (uVar17 != uVar16);
    }
    auVar10 = _DAT_003beea0;
    auVar9 = _DAT_003bee90;
    sVar4 = xu_user->_M_size;
    pdVar11 = xu_user->_M_data;
    if (sVar4 != 0) {
      lVar19 = sVar4 - 1;
      auVar20._8_4_ = (int)lVar19;
      auVar20._0_8_ = lVar19;
      auVar20._12_4_ = (int)((ulong)lVar19 >> 0x20);
      uVar17 = 0;
      auVar20 = auVar20 ^ _DAT_003beea0;
      do {
        auVar22._8_4_ = (int)uVar17;
        auVar22._0_8_ = uVar17;
        auVar22._12_4_ = (int)(uVar17 >> 0x20);
        auVar22 = (auVar22 | auVar9) ^ auVar10;
        if ((bool)(~(auVar22._4_4_ == auVar20._4_4_ && auVar20._0_4_ < auVar22._0_4_ ||
                    auVar20._4_4_ < auVar22._4_4_) & 1)) {
          pdVar11[uVar17] = INFINITY;
        }
        if ((auVar22._12_4_ != auVar20._12_4_ || auVar22._8_4_ <= auVar20._8_4_) &&
            auVar22._12_4_ <= auVar20._12_4_) {
          pdVar11[uVar17 + 1] = INFINITY;
        }
        uVar17 = uVar17 + 2;
      } while ((sVar4 + 1 & 0xfffffffffffffffe) != uVar17);
    }
    if (piVar13 != piVar8) {
      pdVar12 = zl_solver->_M_data + lVar18;
      do {
        pdVar11[*piVar13] = *pdVar12;
        piVar13 = piVar13 + 1;
        pdVar12 = pdVar12 + 1;
      } while (piVar13 != piVar8);
    }
    auVar9 = _DAT_003be0d0;
    if (0 < iVar3) {
      pcVar5 = (this->constr_type_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar11 = zl_solver->_M_data;
      pdVar12 = slack_user->_M_data;
      pdVar6 = zu_solver->_M_data;
      lVar19 = 0;
      do {
        cVar1 = pcVar5[lVar19];
        if (cVar1 == '>') {
          dVar21 = (double)((ulong)pdVar11[lVar19] ^ auVar9._0_8_);
LAB_003aaa2d:
          pdVar12[lVar19] = dVar21;
        }
        else {
          if (cVar1 == '=') {
            dVar21 = 0.0;
            goto LAB_003aaa2d;
          }
          if (cVar1 == '<') {
            dVar21 = pdVar6[lVar19];
            goto LAB_003aaa2d;
          }
        }
        lVar19 = lVar19 + 1;
      } while (lVar18 != lVar19);
    }
  }
  else {
    if (0 < (long)this->num_var_) {
      pdVar11 = (double *)x_user->_M_size;
      if (pdVar11 != (double *)0x0) {
        pdVar11 = x_user->_M_data;
      }
      pdVar12 = (double *)x_solver->_M_size;
      if (pdVar12 != (double *)0x0) {
        pdVar12 = x_solver->_M_data;
      }
      memmove(pdVar11,pdVar12,(long)this->num_var_ << 3);
    }
    auVar9 = _DAT_003be0d0;
    if (0 < (int)uVar2) {
      pcVar5 = (this->constr_type_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar11 = y_user->_M_data;
      pdVar12 = y_solver->_M_data;
      pdVar6 = zu_solver->_M_data;
      pdVar7 = zl_solver->_M_data;
      uVar16 = 0;
      do {
        cVar1 = pcVar5[uVar16];
        if (cVar1 == '<') {
          dVar21 = (double)((ulong)pdVar7[lVar19 + uVar16] ^ auVar9._0_8_);
LAB_003aa562:
          pdVar11[uVar16] = dVar21;
        }
        else {
          if (cVar1 == '>') {
            dVar21 = pdVar6[lVar19 + uVar16];
            goto LAB_003aa562;
          }
          if (cVar1 == '=') {
            dVar21 = pdVar12[uVar16];
            goto LAB_003aa562;
          }
        }
        uVar16 = uVar16 + 1;
      } while (uVar17 != uVar16);
    }
    if (0 < (long)this->num_var_) {
      pdVar11 = (double *)zl_user->_M_size;
      if (pdVar11 != (double *)0x0) {
        pdVar11 = zl_user->_M_data;
      }
      pdVar12 = (double *)zl_solver->_M_size;
      if (pdVar12 != (double *)0x0) {
        pdVar12 = zl_solver->_M_data;
      }
      memmove(pdVar11,pdVar12,(long)this->num_var_ << 3);
      if (0 < (long)this->num_var_) {
        pdVar11 = (double *)zu_user->_M_size;
        if (pdVar11 != (double *)0x0) {
          pdVar11 = zu_user->_M_data;
        }
        pdVar12 = (double *)zu_solver->_M_size;
        if (pdVar12 != (double *)0x0) {
          pdVar12 = zu_solver->_M_data;
        }
        memmove(pdVar11,pdVar12,(long)this->num_var_ << 3);
        if (0 < (long)this->num_var_) {
          pdVar11 = (double *)xl_user->_M_size;
          if (pdVar11 != (double *)0x0) {
            pdVar11 = xl_user->_M_data;
          }
          pdVar12 = (double *)xl_solver->_M_size;
          if (pdVar12 != (double *)0x0) {
            pdVar12 = xl_solver->_M_data;
          }
          memmove(pdVar11,pdVar12,(long)this->num_var_ << 3);
          if (0 < (long)this->num_var_) {
            pdVar11 = (double *)xu_user->_M_size;
            if (pdVar11 != (double *)0x0) {
              pdVar11 = xu_user->_M_data;
            }
            pdVar12 = (double *)xu_solver->_M_size;
            if (pdVar12 != (double *)0x0) {
              pdVar12 = xu_solver->_M_data;
            }
            memmove(pdVar11,pdVar12,(long)this->num_var_ << 3);
          }
        }
      }
    }
    auVar9 = _DAT_003be0d0;
    if (0 < (int)uVar2) {
      pcVar5 = (this->constr_type_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar11 = slack_user->_M_data;
      pdVar12 = xu_solver->_M_data;
      pdVar6 = xl_solver->_M_data;
      uVar16 = 0;
      do {
        cVar1 = pcVar5[uVar16];
        if (cVar1 == '>') {
          dVar21 = (double)((ulong)pdVar12[lVar19 + uVar16] ^ auVar9._0_8_);
LAB_003aa6c8:
          pdVar11[uVar16] = dVar21;
        }
        else {
          if (cVar1 == '=') {
            dVar21 = 0.0;
            goto LAB_003aa6c8;
          }
          if (cVar1 == '<') {
            dVar21 = pdVar6[lVar19 + uVar16];
            goto LAB_003aa6c8;
          }
        }
        uVar16 = uVar16 + 1;
      } while (uVar17 != uVar16);
    }
  }
  return;
}

Assistant:

void Model::DualizeBackInteriorSolution(const Vector& x_solver,
                                        const Vector& xl_solver,
                                        const Vector& xu_solver,
                                        const Vector& y_solver,
                                        const Vector& zl_solver,
                                        const Vector& zu_solver,
                                        Vector& x_user,
                                        Vector& xl_user,
                                        Vector& xu_user,
                                        Vector& slack_user,
                                        Vector& y_user,
                                        Vector& zl_user,
                                        Vector& zu_user) const {
    const Int m = rows();
    const Int n = cols();

    if (dualized_) {
        assert(num_var_ == m);
        assert(num_constr_ + (Int)boxed_vars_.size() == n);
        x_user = -y_solver;

        // If the solution from the solver would be exact, we could copy the
        // first num_constr_ entries from x_solver into y_user. However, to
        // satisfy the sign condition on y_user even if the solution is not
        // exact, we have to use the xl_solver and xu_solver entries for
        // inequality constraints.
        for (Int i = 0; i < num_constr_; i++) {
            switch (constr_type_[i]) {
            case '=':
                y_user[i] = x_solver[i];
                break;
            case '<':
                y_user[i] = -xu_solver[i];
                break;
            case '>':
                y_user[i] = xl_solver[i];
                break;
            }
            assert(std::isfinite(y_user[i]));
        }

        // Dual variables associated with lbuser <= x in the scaled user model
        // are the slack variables from the solver. For an exact solution we
        // would have x_solver[n+1:n+m] == xl_solver[n+1:n+m]. Using xl_solver
        // guarantees that zl_user >= 0 in any case. If variable j has no lower
        // bound in the scaled user model (i.e. is free), then the j-th slack
        // variable was fixed at zero in the solver model, but the IPM solution
        // may not satisfy this. Hence we must set zl_user[j] = 0 explicitly.
        std::copy_n(std::begin(xl_solver) + n, num_var_, std::begin(zl_user));
        for (Int j = 0; j < num_var_; j++)
            if (!std::isfinite(scaled_lbuser_[j]))
                zl_user[j] = 0.0;

        // Dual variables associated with x <= ubuser in the scaled user model
        // are the primal variables that were added for boxed variables in the
        // solver model.
        zu_user = 0.0;
        Int k = num_constr_;
        for (Int j : boxed_vars_)
            zu_user[j] = xl_solver[k++];
        assert(k == n);

        // xl in the scaled user model is zl[n+1:n+m] in the solver model or
        // infinity.
        for (Int i = 0; i < m; i++) {
            if (std::isfinite(scaled_lbuser_[i]))
                xl_user[i] = zl_solver[n+i];
            else
                xl_user[i] = INFINITY;
        }

        // xu in the scaled user model are the entries in zl for columns of the
        // negative identity matrix (that were added for boxed variables).
        xu_user = INFINITY;
        k = num_constr_;
        for (Int j : boxed_vars_)
            xu_user[j] = zl_solver[k++];
        assert(k == n);
        
        for (Int i = 0; i < num_constr_; i++) {
            switch (constr_type_[i]) {
            case '=':
                slack_user[i] = 0.0;
                break;
            case '<':
                slack_user[i] = zu_solver[i];
                break;
            case '>':
                slack_user[i] = -zl_solver[i];
                break;
            }
        }
    }
    else {
        assert(num_constr_ == m);
        assert(num_var_ == n);
        std::copy_n(std::begin(x_solver), num_var_, std::begin(x_user));

        // Instead of copying y_solver into y_user, we use the entries from
        // zl_solver and zu_solver for inequality constraints, so that the sign
        // condition on y_user is satisfied.
        for (Int i = 0; i < m; i++) {
            assert(lb_[n+i] == 0.0 || lb_[n+i] == -INFINITY);
            assert(ub_[n+i] == 0.0 || ub_[n+i] ==  INFINITY);
            assert(lb_[n+i] == 0.0 || ub_[n+i] == 0.0);
            switch (constr_type_[i]) {
            case '=':
                y_user[i] = y_solver[i];
                break;
            case '<':
                y_user[i] = -zl_solver[n+i];
                break;
            case '>':
                y_user[i] = zu_solver[n+i];
                break;
            }
            assert(std::isfinite(y_user[i]));
        }
        std::copy_n(std::begin(zl_solver), num_var_, std::begin(zl_user));
        std::copy_n(std::begin(zu_solver), num_var_, std::begin(zu_user));
        std::copy_n(std::begin(xl_solver), num_var_, std::begin(xl_user));
        std::copy_n(std::begin(xu_solver), num_var_, std::begin(xu_user));

        // If the solution would be exact, slack_user were given by the entries
        // of x_solver corresponding to slack columns. To satisfy the sign
        // condition in any case, we build the slack for inequality constraints
        // from xl_solver and xu_solver and set the slack for equality
        // constraints to zero.
        for (Int i = 0; i < m; i++) {
            switch (constr_type_[i]) {
            case '=':
                slack_user[i] = 0.0;
                break;
            case '<':
                slack_user[i] = xl_solver[n+i];
                break;
            case '>':
                slack_user[i] = -xu_solver[n+i];
                break;
            }
            assert(std::isfinite(slack_user[i]));
        }
    }
}